

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *this,size_t rows,size_t cols,
          VectorDynSize *memoryReserveDescription)

{
  VectorDynSize *in_RCX;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *in_RDX;
  size_t in_RSI;
  VectorDynSize *in_RDI;
  VectorDynSize *vectorSize;
  size_t *vector;
  
  VectorDynSize::VectorDynSize(in_RDI);
  vectorSize = in_RDI + 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x775302);
  vector = &in_RDI[1].m_capacity;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x775315);
  in_RDI[2].m_size = 0;
  in_RDI[2].m_capacity = in_RSI;
  in_RDI[3]._vptr_VectorDynSize = (_func_int **)in_RDX;
  VectorDynSize::data(in_RCX);
  VectorDynSize::size(in_RCX);
  initializeMatrix(in_RDX,(size_t)in_RDI,(double *)vector,(size_t)vectorSize);
  return;
}

Assistant:

SparseMatrix<iDynTree::ColumnMajor>::SparseMatrix(std::size_t rows, std::size_t cols, const iDynTree::VectorDynSize& memoryReserveDescription)
    : m_allocatedSize(0)
    , m_rows(rows)
    , m_columns(cols)
    {
        initializeMatrix(cols, memoryReserveDescription.data(), memoryReserveDescription.size());
    }